

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O3

int jsonnet::internal::encode_utf8(char32_t x,string *s)

{
  char32_t cVar1;
  int iVar2;
  char cVar3;
  
  cVar1 = L'�';
  if ((uint)x < 0x110000) {
    cVar1 = x;
  }
  cVar3 = (char)s;
  if (0x7f < (uint)cVar1) {
    if (0x7ff < (uint)cVar1) {
      if (0xffff < (uint)cVar1) {
        std::__cxx11::string::push_back(cVar3);
      }
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
  }
  iVar2 = std::__cxx11::string::push_back(cVar3);
  return iVar2;
}

Assistant:

static inline int encode_utf8(char32_t x, std::string &s)
{
    if (x >= JSONNET_CODEPOINT_MAX)
        x = JSONNET_CODEPOINT_ERROR;

    // 00ZZZzzz 00zzYYYY 00Yyyyxx 00xxxxxx
    long bytes = ((x & 0x1C0000) << 6) | ((x & 0x03F000) << 4) | ((x & 0x0FC0) << 2) | (x & 0x3F);

    if (x < 0x80) {
        s.push_back((char)x);
        return 1;
    } else if (x < 0x800) {  // note that capital 'Y' bits must be 0
        bytes |= 0xC080;
        s.push_back((bytes >> 8) & 0xFF);
        s.push_back((bytes >> 0) & 0xFF);
        return 2;
    } else if (x < 0x10000) {  // note that 'z' bits must be 0
        bytes |= 0xE08080;
        s.push_back((bytes >> 16) & 0xFF);
        s.push_back((bytes >> 8) & 0xFF);
        s.push_back((bytes >> 0) & 0xFF);
        return 3;
    } else if (x < 0x110000) {  // note that capital 'Z' bits must be 0
        bytes |= 0xF0808080;
        s.push_back((bytes >> 24) & 0xFF);
        s.push_back((bytes >> 16) & 0xFF);
        s.push_back((bytes >> 8) & 0xFF);
        s.push_back((bytes >> 0) & 0xFF);
        return 4;
    } else {
        std::cerr << "Should never get here." << std::endl;
        abort();
    }
}